

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.hpp
# Opt level: O1

int __thiscall
qclab::io::QASMFile::
parse1a<qclab::qgates::Phase<std::complex<float>>,qclab::QObject<std::complex<float>>>
          (QASMFile *this,string *name,string *command,
          unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
          *gate)

{
  pointer pcVar1;
  QObject<std::complex<float>_> *pQVar2;
  int iVar3;
  string *psVar4;
  Phase<std::complex<float>_> *this_00;
  bool bVar5;
  float theta;
  long *local_80;
  size_t local_78;
  long local_70 [2];
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  *local_60;
  size_type local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_58 = (this->qregName_)._M_string_length;
  std::__cxx11::string::substr((ulong)&local_50,(ulong)command);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_80);
  local_60 = gate;
  if (local_48 == local_78) {
    if (local_48 == 0) {
      bVar5 = true;
    }
    else {
      iVar3 = bcmp(local_50,local_80,local_48);
      bVar5 = iVar3 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  iVar3 = 0;
  if (bVar5) {
    psVar4 = (string *)std::__cxx11::string::erase((ulong)command,0);
    theta = parseAngle<float>(this,psVar4);
    psVar4 = (string *)std::__cxx11::string::erase((ulong)command,0);
    iVar3 = parseQubit(this,psVar4);
    this_00 = (Phase<std::complex<float>_> *)operator_new(0x18);
    qgates::Phase<std::complex<float>_>::Phase(this_00,iVar3,theta,false);
    pQVar2 = (local_60->_M_t).
             super___uniq_ptr_impl<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::QObject<std::complex<float>_>_*,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
             .super__Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false>._M_head_impl;
    (local_60->_M_t).
    super___uniq_ptr_impl<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_qclab::QObject<std::complex<float>_>_*,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
    .super__Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false>._M_head_impl =
         (QObject<std::complex<float>_> *)this_00;
    iVar3 = 1;
    if (pQVar2 != (QObject<std::complex<float>_> *)0x0) {
      (*pQVar2->_vptr_QObject[0xd])();
    }
  }
  return iVar3;
}

Assistant:

int parse1a( std::string name , std::string& command ,
                   std::unique_ptr< GATE >& gate ) const {
        using T = typename G::value_type ;
        using R = qclab::real_t< T > ;
        const auto n1 = name.length() ;
        const auto n2 = qregName_.length() ;
        if ( command.substr( 0 , n1 + 1 ) == name + "(" ) {
          const auto angle = parseAngle< R >( command.erase( 0 , n1 + 1 ) ) ;
          const auto qubit = parseQubit(      command.erase( 0 , n2 + 1 ) ) ;
          gate = std::make_unique< G >( qubit , angle ) ;
          return 1 ;
        }
        return 0 ;
      }